

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_buffer_header_with_size(void *buf,size_t *bufsiz,char *fid)

{
  flatbuffers_uoffset_t fVar1;
  flatbuffers_thash_t fVar2;
  flatbuffers_thash_t fVar3;
  int c_4;
  int c_3;
  int c_2;
  int c_1;
  int c;
  size_t size_field;
  flatbuffers_thash_t id2;
  flatbuffers_thash_t id;
  char *fid_local;
  size_t *bufsiz_local;
  void *buf_local;
  
  if (((ulong)buf & 3) == 0) {
    if (*bufsiz < 0xfffffff8) {
      if (*bufsiz < 0xc) {
        buf_local._4_4_ = 1;
      }
      else {
        fVar1 = read_uoffset(buf,0);
        if (*bufsiz - 4 < (ulong)fVar1) {
          buf_local._4_4_ = 0x24;
        }
        else {
          if (fid != (char *)0x0) {
            fVar2 = read_thash_identifier(fid);
            fVar3 = read_thash(buf,4);
            if (fVar2 != 0 && fVar3 != fVar2) {
              return 2;
            }
          }
          *bufsiz = (ulong)fVar1 + 4;
          buf_local._4_4_ = 0;
        }
      }
    }
    else {
      buf_local._4_4_ = 6;
    }
  }
  else {
    buf_local._4_4_ = 5;
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_buffer_header_with_size(const void *buf, size_t *bufsiz, const char *fid)
{
    thash_t id, id2;
    size_t size_field;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(*bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);

    /* Size field, offset field, optional identifier field that must be read even if not present. */
    verify(*bufsiz >= 2 * offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);

    size_field = (size_t)read_uoffset(buf, 0);
    verify_runtime(size_field <= *bufsiz - offset_size, flatcc_verify_error_runtime_buffer_size_less_than_size_field);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    *bufsiz = size_field + offset_size;
    return flatcc_verify_ok;
}